

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O1

void __thiscall CppMLNN::check_gradient(CppMLNN *this,MatrixXd *examples,MatrixXd *labels)

{
  double *pdVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  pointer ppVar5;
  long lVar6;
  double dVar7;
  CppMLNN *pCVar8;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  Z_1;
  MatrixXd grad_compute;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  gradients;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  A_1;
  value_type grad_bp;
  vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  model_cp;
  MatrixXd examples_batch;
  MatrixXd labels_batch;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  A;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  Z;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_1e8;
  CppMLNN *local_1c8;
  pointer local_1c0;
  pointer local_1b8;
  Matrix<double,__1,__1,_0,__1,__1> local_1b0;
  undefined1 local_198 [24];
  MatrixXd *local_180;
  variable_if_dynamic<long,__1> local_178;
  variable_if_dynamic<long,__1> vStack_170;
  long local_168;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_158;
  double local_140;
  DenseStorage<double,__1,__1,__1,_0> local_138;
  vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_120;
  MatrixXd local_108;
  MatrixXd local_f0;
  vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_d8;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_b8;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_98;
  vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_78;
  vector<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_60;
  MatrixXd local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"espsilon:",9);
  poVar2 = std::ostream::_M_insert<double>(1e-07);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_198._0_8_ =
       (examples->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_198._8_8_ =
       (examples->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
  ;
  local_198._16_8_ = (pointer)0x2;
  if (-1 < (long)local_198._8_8_ || (pointer)local_198._0_8_ == (pointer)0x0) {
    local_178.m_value = 0;
    vStack_170.m_value = 0;
    local_180 = examples;
    local_168 = local_198._8_8_;
    if ((-1 < (long)local_198._8_8_) &&
       (1 < (examples->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols)) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_108,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)local_198);
      local_198._0_8_ =
           (labels->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
      local_198._8_8_ =
           (labels->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
      local_198._16_8_ = (pointer)0x2;
      if ((long)local_198._8_8_ < 0 && (pointer)local_198._0_8_ != (pointer)0x0) goto LAB_0011fa0a;
      local_178.m_value = 0;
      vStack_170.m_value = 0;
      local_180 = labels;
      local_168 = local_198._8_8_;
      if ((-1 < (long)local_198._8_8_) &&
         (1 < (labels->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols)) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f0,
                   (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                    *)local_198);
        std::
        vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
        ::vector(&local_120,&this->m_model);
        ppVar5 = local_120.
                 super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        Eigen::internal::
        conservative_resize_like_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
        ::run((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)ppVar5,
              local_120.
              super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].first.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows,
              local_120.
              super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].first.
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols + 1)
        ;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  ((ColXpr *)local_198,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)ppVar5,
                   local_120.
                   super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].first.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
                   + -1);
        Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                  ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)local_198,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                   &local_120.
                    super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].second);
        local_198._16_8_ = (pointer)0x0;
        local_198._0_8_ = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
        local_198._8_8_ = 0;
        local_98.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_98.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.
        super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.
        super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.
        super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        forward_propagation(this,&local_108,&local_98,&local_b8,&local_d8);
        std::
        vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
        ::~vector(&local_d8);
        back_propagation(&local_48,this,&local_98,&local_b8,&local_f0,
                         (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          *)local_198);
        free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  (&local_138,(DenseStorage<double,__1,__1,__1,_0> *)local_198._0_8_);
        local_1e8.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)local_120.
                      super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].first.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_rows;
        local_1e8.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_120.
                      super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[-1].first.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols;
        local_1e8.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((long)((ulong)local_1e8.
                          super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish |
                  (ulong)local_1e8.
                         super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0) {
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CwiseNullaryOp.h"
                        ,0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                       );
        }
        local_1c0 = ppVar5;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1b0,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)&local_1e8);
        if (0 < local_120.
                super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].first.
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
          lVar4 = 0;
          local_1b8 = local_120.
                      super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          ppVar5 = local_120.
                   super__Vector_base<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_1c8 = this;
          do {
            if (0 < ppVar5[-1].first.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols) {
              lVar6 = 0;
              do {
                local_1e8.
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_1e8.
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1e8.
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_158.
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_158.
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_158.
                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                lVar3 = ppVar5[-1].first.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_rows;
                if ((lVar3 <= lVar4) ||
                   (ppVar5[-1].first.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols <= lVar6)) {
LAB_0011fa67:
                  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/DenseCoeffsBase.h"
                                ,0x16d,
                                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                               );
                }
                lVar3 = lVar3 * lVar6;
                pdVar1 = (local_1c0->first).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_data;
                pdVar1[lVar3 + lVar4] = pdVar1[lVar3 + lVar4] + 1e-07;
                std::
                vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
                ::vector(&local_60,&local_120);
                pCVar8 = local_1c8;
                forward_propagation(local_1c8,&local_108,&local_1e8,&local_158,&local_60);
                std::
                vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
                ::~vector(&local_60);
                local_140 = loss(pCVar8,local_1e8.
                                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + -1,&local_f0);
                lVar3 = local_1b8[-1].first.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_rows;
                if ((lVar3 <= lVar4) ||
                   (local_1b8[-1].first.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols <= lVar6)) goto LAB_0011fa67;
                lVar3 = lVar3 * lVar6;
                pdVar1 = (local_1c0->first).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_data;
                pdVar1[lVar3 + lVar4] = pdVar1[lVar3 + lVar4] + -2e-07;
                std::
                vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
                ::vector(&local_78,&local_120);
                pCVar8 = local_1c8;
                forward_propagation(local_1c8,&local_108,&local_1e8,&local_158,&local_78);
                std::
                vector<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
                ::~vector(&local_78);
                dVar7 = loss(pCVar8,local_1e8.
                                    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1,&local_f0);
                ppVar5 = local_1b8;
                if ((local_1b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows <= lVar4) ||
                   (local_1b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols <= lVar6)) goto LAB_0011fa67;
                local_1b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_data[local_1b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows * lVar6 + lVar4] = (local_140 - dVar7) / 2e-07;
                lVar3 = local_1b8[-1].first.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_rows;
                if ((lVar3 <= lVar4) ||
                   (local_1b8[-1].first.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols <= lVar6)) goto LAB_0011fa67;
                lVar3 = lVar3 * lVar6;
                pdVar1 = local_1b8[-1].first.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_data;
                pdVar1[lVar3 + lVar4] = pdVar1[lVar3 + lVar4] + 1e-07;
                std::
                vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                ::~vector(&local_158);
                std::
                vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                ::~vector(&local_1e8);
                lVar6 = lVar6 + 1;
              } while (lVar6 < ppVar5[-1].first.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < ppVar5[-1].first.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"difference: ",0xc)
        ;
        local_1e8.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = &local_1b0;
        local_1e8.
        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_138;
        if ((local_1b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows == local_138.m_rows) &&
           (local_1b0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols == local_138.m_cols)) {
          local_1c0 = (pointer)Eigen::
                               MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                               ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)&local_1e8);
          local_1c8 = (CppMLNN *)
                      Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::norm
                                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1b0
                                );
          pCVar8 = (CppMLNN *)
                   Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::norm
                             ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_138);
          if ((double)pCVar8 <= (double)local_1c8) {
            pCVar8 = local_1c8;
          }
          std::ostream::operator<<((ostream *)&std::cout,(double)local_1c0 / (double)pCVar8);
          exit(0);
        }
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/CwiseBinaryOp.h"
                      ,0x6e,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                     );
      }
    }
    vStack_170.m_value = 0;
    local_178.m_value = 0;
    local_198._16_8_ = (pointer)0x2;
    local_198._8_8_ = local_168;
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Block.h"
                  ,0x93,
                  "Eigen::Block<const Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
LAB_0011fa0a:
  local_198._16_8_ = (pointer)0x2;
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/MapBase.h"
                ,0xb0,
                "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>>, Level = 0]"
               );
}

Assistant:

void CppMLNN::check_gradient(const MatrixXd& examples, const MatrixXd& labels) {
	double epsilon = pow(10, -7);
	cout << "espsilon:" << epsilon << endl;

	MatrixXd examples_batch = examples.block(0, 0, examples.rows(), 2);
	MatrixXd labels_batch = labels.block(0, 0, labels.rows(), 2);

	auto model_cp = m_model;
	auto& _model = model_cp.back();
	auto& W = _model.first;
	auto& b = _model.second;
	W.conservativeResize(W.rows(), W.cols() + 1);
	W.col(W.cols() - 1) = b;
	auto& theta = W;

	vector<MatrixXd> gradients, Z, A;
	forward_propagation(examples_batch, Z, A);
	back_propagation(Z, A, labels_batch, gradients);
	auto grad_bp = gradients.front();

	MatrixXd grad_compute = MatrixXd::Constant(theta.rows(), theta.cols(), 0);
	for (int i = 0; i < theta.rows(); i++) {
		for (int j = 0; j < theta.cols(); j++) {
			vector<MatrixXd> Z, A;
			theta(i, j) += epsilon;
			forward_propagation(examples_batch, Z, A, model_cp);
			auto J_plus = loss(Z.back(), labels_batch);

			theta(i, j) -= 2 * epsilon;
			forward_propagation(examples_batch, Z, A, model_cp);
			auto J_minus = loss(Z.back(), labels_batch);

			grad_compute(i,j) = (J_plus - J_minus) / (2 * epsilon);

			theta(i, j) += epsilon;
		}
	}

	cout << "difference: " << (grad_compute - grad_bp).norm() / max(grad_compute.norm(), grad_bp.norm());

	exit(0);
}